

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CollateExpression::Deserialize(CollateExpression *this,Deserializer *deserializer)

{
  CollateExpression *this_00;
  pointer pCVar1;
  _Head_base<0UL,_duckdb::CollateExpression_*,_false> local_20;
  
  this_00 = (CollateExpression *)operator_new(0x60);
  CollateExpression(this_00);
  local_20._M_head_impl = this_00;
  pCVar1 = unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
           ::operator->((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,200,"child",&pCVar1->child);
  pCVar1 = unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
           ::operator->((unique_ptr<duckdb::CollateExpression,_std::default_delete<duckdb::CollateExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"collation",&pCVar1->collation);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CollateExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<CollateExpression>(new CollateExpression());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "child", result->child);
	deserializer.ReadPropertyWithDefault<string>(201, "collation", result->collation);
	return std::move(result);
}